

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DivideTest.h
# Opt level: O2

uint32_t DivideTest<unsigned_short>::randomSeed(void)

{
  uint uVar1;
  result_type rVar2;
  uniform_int_distribution<unsigned_int> randDist;
  random_device randomDevice;
  mt19937 randGen;
  param_type local_2720;
  random_device local_2718;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  local_1390;
  
  std::random_device::random_device(&local_2718);
  uVar1 = std::random_device::_M_getval();
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::seed(&local_1390,(ulong)uVar1);
  local_2720._M_a = 1;
  local_2720._M_b = 0xffffffff;
  rVar2 = std::uniform_int_distribution<unsigned_int>::operator()
                    ((uniform_int_distribution<unsigned_int> *)&local_2720,&local_1390);
  std::random_device::~random_device(&local_2718);
  return rVar2;
}

Assistant:

static uint32_t randomSeed() {
#if defined(__AVR__)
        return (uint32_t)analogRead(A0);
#else
        std::random_device randomDevice;
        std::mt19937 randGen(randomDevice());
        std::uniform_int_distribution<uint32_t> randDist(1, std::numeric_limits<uint32_t>::max());
        return randDist(randGen);
#endif
    }